

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeCall(TranslateToFuzzReader *this,Type type)

{
  pointer *this_00;
  pointer puVar1;
  pointer puVar2;
  byte bVar3;
  uint32_t uVar4;
  value_type *pvVar5;
  Type *pTVar6;
  uintptr_t *puVar7;
  Call *pCVar8;
  long extraout_RDX;
  long extraout_RDX_00;
  size_t extraout_RDX_01;
  Function *pFVar9;
  int iVar10;
  bool isReturn;
  bool bVar11;
  Expression *local_98;
  Builder *local_90;
  void *pvStack_88;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  undefined1 local_58 [8];
  Iterator __begin2;
  Call *local_40;
  
  iVar10 = (this->fuzzParams->super_FuzzParams).TRIES;
  local_90 = &this->builder;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = type.id;
  do {
    if (iVar10 < 1) {
      pCVar8 = (Call *)makeTrivial(this,(Type)__begin2.
                                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                              .index);
      return (Expression *)pCVar8;
    }
    pFVar9 = this->funcContext->func;
    puVar1 = (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((puVar1 != puVar2) &&
       (uVar4 = Random::upTo(&this->random,(uint32_t)((ulong)((long)puVar2 - (long)puVar1) >> 3)),
       uVar4 != 0)) {
      pvVar5 = Random::
               pick<std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>>
                         (&this->random,&this->wasm->functions);
      pFVar9 = (pvVar5->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    }
    if ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index == 1) &&
       (((this->wasm->features).features & 0x80) != 0)) {
      wasm::HeapType::getSignature();
      wasm::HeapType::getSignature();
      isReturn = extraout_RDX == extraout_RDX_00;
    }
    else {
      isReturn = false;
    }
    wasm::HeapType::getSignature();
    bVar3 = extraout_RDX_01 ==
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index |
            isReturn;
    if (bVar3 == 1) {
      pvStack_88 = (void *)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)wasm::HeapType::getSignature();
      this_00 = &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      local_58 = (undefined1  [8])this_00;
      pTVar6 = (Type *)Type::size((Type *)this_00);
      bVar11 = local_58 != (undefined1  [8])this_00;
      if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
          pTVar6) goto LAB_0013ebea;
      do {
        do {
          puVar7 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_58);
          local_98 = make(this,(Type)*puVar7);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pvStack_88,
                     &local_98);
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
          bVar11 = local_58 !=
                   (undefined1  [8])
                   &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        } while (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                 != pTVar6);
LAB_0013ebea:
      } while (bVar11);
      local_40 = Builder::makeCall(local_90,(IString)(pFVar9->super_Importable).super_Named.name.
                                                     super_IString,
                                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)&pvStack_88,
                                   (Type)__begin2.
                                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                         .index,isReturn);
      if (pvStack_88 != (void *)0x0) {
        operator_delete(pvStack_88,
                        (long)args.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvStack_88);
      }
    }
    iVar10 = iVar10 + -1;
  } while (bVar3 == 0);
  return (Expression *)local_40;
}

Assistant:

Expression* TranslateToFuzzReader::makeCall(Type type) {
  int tries = fuzzParams->TRIES;
  bool isReturn;
  while (tries-- > 0) {
    Function* target = funcContext->func;
    if (!wasm.functions.empty() && !oneIn(wasm.functions.size())) {
      target = pick(wasm.functions).get();
    }
    isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
               funcContext->func->getResults() == target->getResults();
    if (target->getResults() != type && !isReturn) {
      continue;
    }
    // we found one!
    std::vector<Expression*> args;
    for (const auto& argType : target->getParams()) {
      args.push_back(make(argType));
    }
    return builder.makeCall(target->name, args, type, isReturn);
  }
  // we failed to find something
  return makeTrivial(type);
}